

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool std::numeric_limits<fmt::internal::DummyInt>::isnegative(double x)

{
  bool bVar1;
  double in_XMM0_Qa;
  char buffer [2];
  int sign;
  int dec;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined1 local_1a [2];
  int local_18 [2];
  double local_10;
  bool local_1;
  
  local_10 = in_XMM0_Qa;
  bVar1 = fmt::internal::const_check<bool>(false);
  if (bVar1) {
    local_1 = signbit(local_10);
  }
  else if (0.0 <= local_10) {
    bVar1 = isnotanumber<double>
                      ((double)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (bVar1) {
      local_18[1] = 0;
      local_18[0] = 0;
      fmt::internal::_ecvt_s(local_10,local_1a,2,0,local_18 + 1,local_18);
      local_1 = local_18[0] != 0;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool isnegative(double x) {
    using namespace fmt::internal;
    if (const_check(sizeof(signbit(x)) == sizeof(int)))
      return signbit(x) != 0;
    if (x < 0) return true;
    if (!isnotanumber(x)) return false;
    int dec = 0, sign = 0;
    char buffer[2];  // The buffer size must be >= 2 or _ecvt_s will fail.
    _ecvt_s(buffer, sizeof(buffer), x, 0, &dec, &sign);
    return sign != 0;
  }